

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O3

ostream * operator<<(ostream *os,CuttingPlane *vv)

{
  ostream *poVar1;
  double dVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"plane{\n",7);
  poVar1 = std::ostream::_M_insert<double>((vv->normal).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"*x",2);
  dVar2 = (vv->normal).y;
  if (0.0 <= dVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"+",1);
    dVar2 = (vv->normal).y;
  }
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"*y",2);
  dVar2 = (vv->normal).z;
  if (0.0 <= dVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"+",1);
    dVar2 = (vv->normal).z;
  }
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"*z",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
  poVar1 = std::ostream::_M_insert<double>(vv->start_distance);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"}\n",2);
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const CuttingPlane& vv)
{
  os << "plane{\n";
  os << vv.normal.x << "*x";
  if (vv.normal.y >= 0)
  {
    os << "+";
  }
  os << vv.normal.y << "*y";
  if (vv.normal.z >= 0)
  {
    os << "+";
  }
  os << vv.normal.z << "*z";

  os << ",";

  os << vv.start_distance << "\n";
  os << "}\n";
  return os;
}